

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O2

bool SanityCheckASMap(vector<bool,_std::allocator<bool>_> *asmap,int bits)

{
  uint uVar1;
  ulong *puVar2;
  ulong *puVar3;
  Instruction IVar4;
  uint32_t uVar5;
  _Bit_type *p_Var6;
  uint uVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  uint32_t jump_offset;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> jumps;
  int bits_local;
  const_iterator local_58;
  const_iterator local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar3 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  local_58.super__Bit_iterator_base._M_offset = 0;
  jumps.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  jumps.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  jumps.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bits_local = bits;
  local_58.super__Bit_iterator_base._M_p = puVar2;
  local_48.super__Bit_iterator_base._M_p = puVar3;
  local_48.super__Bit_iterator_base._M_offset = uVar1;
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::reserve
            (&jumps,(long)bits);
  iVar12 = 1;
  puVar9 = puVar2;
  uVar8 = 0;
  bVar11 = false;
LAB_00b00f14:
  if ((puVar9 == puVar3 && uVar8 == uVar1) ||
     ((iVar13 = (int)puVar2,
      jumps.
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      jumps.
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      (jumps.
       super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].first <= uVar8 + ((int)puVar9 - iVar13) * 8)))
     ) goto switchD_00b00f65_default;
  IVar4 = anon_unknown.dwarf_4052a8f::DecodeType(&local_58,&local_48);
  switch(IVar4) {
  case RETURN:
    if ((iVar12 == 3) ||
       (uVar5 = anon_unknown.dwarf_4052a8f::DecodeASN(&local_58,&local_48), uVar5 == 0xffffffff))
    goto switchD_00b00f65_default;
    if (jumps.
        super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        jumps.
        super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar10 = (ulong)local_58.super__Bit_iterator_base._M_offset;
      p_Var6 = local_58.super__Bit_iterator_base._M_p;
      if ((long)((uVar1 - uVar10) +
                ((long)puVar3 - (long)local_58.super__Bit_iterator_base._M_p) * 8) < 8)
      goto LAB_00b01114;
      goto switchD_00b00f65_default;
    }
    if (jumps.
        super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first !=
        ((int)local_58.super__Bit_iterator_base._M_p - iVar13) * 8 +
        local_58.super__Bit_iterator_base._M_offset) goto switchD_00b00f65_default;
    bits_local = jumps.
                 super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].second;
    jumps.
    super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         jumps.
         super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    break;
  case JUMP:
    uVar5 = anon_unknown.dwarf_4052a8f::DecodeJump(&local_58,&local_48);
    if (((uVar5 == 0xffffffff) ||
        ((long)(((ulong)uVar1 - (ulong)local_58.super__Bit_iterator_base._M_offset) +
               ((long)puVar3 - (long)local_58.super__Bit_iterator_base._M_p) * 8) <
         (long)(ulong)uVar5)) || (bits_local == 0)) goto switchD_00b00f65_default;
    bits_local = bits_local + -1;
    jump_offset = local_58.super__Bit_iterator_base._M_offset + uVar5 +
                  ((int)local_58.super__Bit_iterator_base._M_p - iVar13) * 8;
    if ((jumps.
         super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         jumps.
         super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (jumps.
        super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first <= jump_offset))
    goto switchD_00b00f65_default;
    std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
    emplace_back<unsigned_int&,int&>
              ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
               &jumps,&jump_offset,&bits_local);
    break;
  case MATCH:
    uVar5 = anon_unknown.dwarf_4052a8f::DecodeMatch(&local_58,&local_48);
    if (uVar5 == 0xffffffff) goto switchD_00b00f65_default;
    uVar7 = 0x20;
    if (uVar5 != 0) {
      uVar7 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    if (((bool)(bVar11 & (iVar12 == 2 && uVar5 < 0x100))) || (bits_local < (int)(0x1f - uVar7)))
    goto switchD_00b00f65_default;
    iVar12 = 2;
    puVar9 = local_58.super__Bit_iterator_base._M_p;
    uVar8 = local_58.super__Bit_iterator_base._M_offset;
    bits_local = bits_local - (0x1f - uVar7);
    bVar11 = uVar5 < 0x100;
    goto LAB_00b00f14;
  case DEFAULT:
    if (iVar12 != 3) goto LAB_00b01029;
  default:
    goto switchD_00b00f65_default;
  }
  iVar12 = 1;
  puVar9 = local_58.super__Bit_iterator_base._M_p;
  uVar8 = local_58.super__Bit_iterator_base._M_offset;
  goto LAB_00b00f14;
LAB_00b01029:
  uVar5 = anon_unknown.dwarf_4052a8f::DecodeASN(&local_58,&local_48);
  iVar12 = 3;
  puVar9 = local_58.super__Bit_iterator_base._M_p;
  uVar8 = local_58.super__Bit_iterator_base._M_offset;
  if (uVar5 == 0xffffffff) goto switchD_00b00f65_default;
  goto LAB_00b00f14;
switchD_00b00f65_default:
  bVar11 = false;
  goto LAB_00b010e5;
LAB_00b01114:
  while( true ) {
    uVar8 = (uint)uVar10;
    bVar11 = uVar1 == uVar8 && p_Var6 == puVar3;
    if ((bVar11) || ((*p_Var6 >> (uVar10 & 0x3f) & 1) != 0)) break;
    local_58.super__Bit_iterator_base._M_offset = uVar8 + 1;
    uVar10 = (ulong)local_58.super__Bit_iterator_base._M_offset;
    if (uVar8 == 0x3f) {
      local_58.super__Bit_iterator_base._M_offset = 0;
      p_Var6 = p_Var6 + 1;
      uVar10 = 0;
      local_58.super__Bit_iterator_base._M_p = p_Var6;
    }
  }
LAB_00b010e5:
  std::_Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
  ~_Vector_base(&jumps.
                 super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               );
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

bool SanityCheckASMap(const std::vector<bool>& asmap, int bits)
{
    const std::vector<bool>::const_iterator begin = asmap.begin(), endpos = asmap.end();
    std::vector<bool>::const_iterator pos = begin;
    std::vector<std::pair<uint32_t, int>> jumps; // All future positions we may jump to (bit offset in asmap -> bits to consume left)
    jumps.reserve(bits);
    Instruction prevopcode = Instruction::JUMP;
    bool had_incomplete_match = false;
    while (pos != endpos) {
        uint32_t offset = pos - begin;
        if (!jumps.empty() && offset >= jumps.back().first) return false; // There was a jump into the middle of the previous instruction
        Instruction opcode = DecodeType(pos, endpos);
        if (opcode == Instruction::RETURN) {
            if (prevopcode == Instruction::DEFAULT) return false; // There should not be any RETURN immediately after a DEFAULT (could be combined into just RETURN)
            uint32_t asn = DecodeASN(pos, endpos);
            if (asn == INVALID) return false; // ASN straddles EOF
            if (jumps.empty()) {
                // Nothing to execute anymore
                if (endpos - pos > 7) return false; // Excessive padding
                while (pos != endpos) {
                    if (*pos) return false; // Nonzero padding bit
                    ++pos;
                }
                return true; // Sanely reached EOF
            } else {
                // Continue by pretending we jumped to the next instruction
                offset = pos - begin;
                if (offset != jumps.back().first) return false; // Unreachable code
                bits = jumps.back().second; // Restore the number of bits we would have had left after this jump
                jumps.pop_back();
                prevopcode = Instruction::JUMP;
            }
        } else if (opcode == Instruction::JUMP) {
            uint32_t jump = DecodeJump(pos, endpos);
            if (jump == INVALID) return false; // Jump offset straddles EOF
            if (int64_t{jump} > int64_t{endpos - pos}) return false; // Jump out of range
            if (bits == 0) return false; // Consuming bits past the end of the input
            --bits;
            uint32_t jump_offset = pos - begin + jump;
            if (!jumps.empty() && jump_offset >= jumps.back().first) return false; // Intersecting jumps
            jumps.emplace_back(jump_offset, bits);
            prevopcode = Instruction::JUMP;
        } else if (opcode == Instruction::MATCH) {
            uint32_t match = DecodeMatch(pos, endpos);
            if (match == INVALID) return false; // Match bits straddle EOF
            int matchlen = std::bit_width(match) - 1;
            if (prevopcode != Instruction::MATCH) had_incomplete_match = false;
            if (matchlen < 8 && had_incomplete_match) return false; // Within a sequence of matches only at most one should be incomplete
            had_incomplete_match = (matchlen < 8);
            if (bits < matchlen) return false; // Consuming bits past the end of the input
            bits -= matchlen;
            prevopcode = Instruction::MATCH;
        } else if (opcode == Instruction::DEFAULT) {
            if (prevopcode == Instruction::DEFAULT) return false; // There should not be two successive DEFAULTs (they could be combined into one)
            uint32_t asn = DecodeASN(pos, endpos);
            if (asn == INVALID) return false; // ASN straddles EOF
            prevopcode = Instruction::DEFAULT;
        } else {
            return false; // Instruction straddles EOF
        }
    }
    return false; // Reached EOF without RETURN instruction
}